

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DrawMesh
          (VulkanCommandBuffer *this,uint32_t TaskCountX,uint32_t TaskCountY,uint32_t TaskCountZ)

{
  bool bVar1;
  Char *pCVar2;
  undefined4 in_register_0000000c;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  uint32_t TaskCountZ_local;
  uint32_t TaskCountY_local;
  uint32_t TaskCountX_local;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._12_4_ = TaskCountZ;
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [32])CONCAT44(in_register_0000000c,TaskCountZ));
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawMesh",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xc1);
    std::__cxx11::string::~string((string *)local_40);
  }
  bVar1 = IsInRenderScope(this);
  if (!bVar1) {
    Diligent::FormatString<char[58]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [58])"vkCmdDrawMeshTasksEXT() must be called inside render pass");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawMesh",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xc2);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if ((this->m_State).GraphicsPipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[27]>((string *)local_90,(char (*) [27])"No graphics pipeline bound")
    ;
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"DrawMesh",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0xc3);
    std::__cxx11::string::~string((string *)local_90);
  }
  (*vkCmdDrawMeshTasksEXT)(this->m_VkCmdBuffer,TaskCountX,TaskCountY,msg.field_2._12_4_);
  return;
}

Assistant:

__forceinline void DrawMesh(uint32_t TaskCountX, uint32_t TaskCountY, uint32_t TaskCountZ)
    {
#if DILIGENT_USE_VOLK
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(IsInRenderScope(), "vkCmdDrawMeshTasksEXT() must be called inside render pass");
        VERIFY(m_State.GraphicsPipeline != VK_NULL_HANDLE, "No graphics pipeline bound");

        vkCmdDrawMeshTasksEXT(m_VkCmdBuffer, TaskCountX, TaskCountY, TaskCountZ);
#else
        UNSUPPORTED("DrawMesh is not supported when vulkan library is linked statically");
#endif
    }